

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap.c
# Opt level: O2

u_char * pcap_next(pcap_t *p,pcap_pkthdr *h)

{
  int iVar1;
  u_char *pkt;
  oneshot_userdata s;
  
  s.pkt = &pkt;
  s.hdr = h;
  s.pd = p;
  iVar1 = (*p->read_op)(p,1,p->oneshot_callback,(u_char *)&s);
  if (iVar1 < 1) {
    pkt = (u_char *)0x0;
  }
  return pkt;
}

Assistant:

const u_char *
pcap_next(pcap_t *p, struct pcap_pkthdr *h)
{
	struct oneshot_userdata s;
	const u_char *pkt;

	s.hdr = h;
	s.pkt = &pkt;
	s.pd = p;
	if (pcap_dispatch(p, 1, p->oneshot_callback, (u_char *)&s) <= 0)
		return (0);
	return (pkt);
}